

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int xpath_derived_from_or_self
              (lyxp_set **args,uint16_t UNUSED_arg_count,lyd_node *cur_node,lys_module *param_4,
              lyxp_set *set,int options)

{
  byte bVar1;
  long *plVar2;
  lys_ident *ident;
  int iVar3;
  char *pcVar4;
  lyxp_set *plVar5;
  uint uVar6;
  ulong uVar7;
  
  if ((*args)->type < LYXP_SET_SNODE_SET) {
    iVar3 = lyxp_set_cast(args[1],LYXP_SET_STRING,cur_node,param_4,options);
    if (iVar3 == 0) {
      set_fill_boolean(set,0);
      plVar5 = *args;
      if (plVar5->type == LYXP_SET_EMPTY) {
        return 0;
      }
      uVar6 = 0;
      do {
        if (plVar5->used <= (uVar6 & 0xffff)) {
          return 0;
        }
        plVar2 = *(long **)((long)&((plVar5->val).nodes)->node + (ulong)((uVar6 & 0xffff) << 4));
        if (((*(byte *)(*plVar2 + 0x38) & 0xc) != 0) && (*(int *)(*plVar2 + 0x80) == 7)) {
          ident = (lys_ident *)plVar2[7];
          pcVar4 = (args[1]->val).str;
          iVar3 = xpath_derived_from_ident_cmp(ident,pcVar4);
          if (iVar3 == 0) {
            set_fill_boolean(set,1);
            return 0;
          }
          bVar1 = ident->base_size;
          for (uVar7 = 0; bVar1 != uVar7; uVar7 = uVar7 + 1) {
            iVar3 = xpath_derived_from_ident_cmp(ident->base[uVar7],pcVar4);
            if (iVar3 == 0) {
              set_fill_boolean(set,1);
              if (uVar7 < *(byte *)(plVar2[7] + 0x1f)) {
                return 0;
              }
              break;
            }
          }
          plVar5 = *args;
        }
        uVar6 = uVar6 + 1;
      } while( true );
    }
  }
  else {
    pcVar4 = print_set_type(*args);
    ly_vlog(LYE_XPATH_INARGTYPE,LY_VLOG_NONE,(void *)0x0,1,pcVar4,
            "derived-from-or-self(node-set, string)");
  }
  return -1;
}

Assistant:

static int
xpath_derived_from_or_self(struct lyxp_set **args, uint16_t UNUSED(arg_count), struct lyd_node *cur_node,
                           struct lys_module *local_mod, struct lyxp_set *set, int options)
{
    uint16_t i, j;
    struct lyd_node_leaf_list *leaf;
    struct lys_node_leaf *sleaf;

    if ((args[0]->type != LYXP_SET_NODE_SET) && (args[0]->type != LYXP_SET_EMPTY)) {
        LOGVAL(LYE_XPATH_INARGTYPE, LY_VLOG_NONE, NULL, 1, print_set_type(args[0]), "derived-from-or-self(node-set, string)");
        return -1;
    }
    if (lyxp_set_cast(args[1], LYXP_SET_STRING, cur_node, local_mod, options)) {
        return -1;
    }

    set_fill_boolean(set, 0);
    if (args[0]->type != LYXP_SET_EMPTY) {
        for (i = 0; i < args[0]->used; ++i) {
            leaf = (struct lyd_node_leaf_list *)args[0]->val.nodes[i].node;
            sleaf = (struct lys_node_leaf *)leaf->schema;
            if ((sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST)) && (sleaf->type.base == LY_TYPE_IDENT)) {
                if (!xpath_derived_from_ident_cmp(leaf->value.ident, args[1]->val.str)) {
                    set_fill_boolean(set, 1);
                    break;
                }

                for (j = 0; j < leaf->value.ident->base_size; ++j) {
                    if (!xpath_derived_from_ident_cmp(leaf->value.ident->base[j], args[1]->val.str)) {
                        set_fill_boolean(set, 1);
                        break;
                    }
                }

                if (j < leaf->value.ident->base_size) {
                    break;
                }
            }
        }
    }

    return EXIT_SUCCESS;
}